

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

bool compactor_switch_compaction_flag(filemgr *file,bool flag)

{
  avl_node *paVar1;
  bool bVar2;
  openfiles_elem_conflict query;
  char acStack_548 [1296];
  avl_node local_38 [2];
  
  strcpy(acStack_548,file->filename);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(&openfiles,local_38,_compactor_cmp);
  if ((paVar1 == (avl_node *)0x0) || ((bool)*(char *)((long)&paVar1[-1].left + 4) == flag)) {
    bVar2 = false;
  }
  else {
    *(bool *)((long)&paVar1[-1].left + 4) = flag;
    bVar2 = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return bVar2;
}

Assistant:

bool compactor_switch_compaction_flag(struct filemgr *file, bool flag)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        // found
        elem = _get_entry(a, struct openfiles_elem, avl);
        if (elem->compaction_flag == flag) {
            // already switched by other thread .. return false
            mutex_unlock(&cpt_lock);
            return false;
        }
        // switch
        elem->compaction_flag = flag;
        mutex_unlock(&cpt_lock);
        return true;
    }
    // file doesn't exist .. already compacted or deregistered
    mutex_unlock(&cpt_lock);
    return false;
}